

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slcand.c
# Opt level: O0

void print_usage(char *prg)

{
  undefined8 in_RDI;
  
  fprintf(_stderr,"%s - userspace daemon for serial line CAN interface driver SLCAN.\n",in_RDI);
  fprintf(_stderr,"\nUsage: %s [options] <tty> [canif-name]\n\n",in_RDI);
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"         -o          (send open command \'O\\r\')\n");
  fprintf(_stderr,"         -c          (send close command \'C\\r\')\n");
  fprintf(_stderr,"         -f          (read status flags with \'F\\r\' to reset error states)\n");
  fprintf(_stderr,"         -l          (send listen only command \'L\\r\', overrides -o)\n");
  fprintf(_stderr,"         -s <speed>  (set CAN speed 0..8)\n");
  fprintf(_stderr,"         -S <speed>  (set UART speed in baud)\n");
  fprintf(_stderr,"         -t <type>   (set UART flow control type \'hw\' or \'sw\')\n");
  fprintf(_stderr,"         -b <btr>    (set bit time register value)\n");
  fprintf(_stderr,"         -F          (stay in foreground; no daemonize)\n");
  fprintf(_stderr,"         -h          (show this help page)\n");
  fprintf(_stderr,"\nExamples:\n");
  fprintf(_stderr,"slcand -o -c -f -s6 ttyUSB0\n\n");
  fprintf(_stderr,"slcand -o -c -f -s6 ttyUSB0 can0\n\n");
  fprintf(_stderr,"slcand -o -c -f -s6 /dev/ttyUSB0\n\n");
  exit(1);
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "%s - userspace daemon for serial line CAN interface driver SLCAN.\n", prg);
	fprintf(stderr, "\nUsage: %s [options] <tty> [canif-name]\n\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -o          (send open command 'O\\r')\n");
	fprintf(stderr, "         -c          (send close command 'C\\r')\n");
	fprintf(stderr, "         -f          (read status flags with 'F\\r' to reset error states)\n");
	fprintf(stderr, "         -l          (send listen only command 'L\\r', overrides -o)\n");
	fprintf(stderr, "         -s <speed>  (set CAN speed 0..8)\n");
	fprintf(stderr, "         -S <speed>  (set UART speed in baud)\n");
	fprintf(stderr, "         -t <type>   (set UART flow control type 'hw' or 'sw')\n");
	fprintf(stderr, "         -b <btr>    (set bit time register value)\n");
	fprintf(stderr, "         -F          (stay in foreground; no daemonize)\n");
	fprintf(stderr, "         -h          (show this help page)\n");
	fprintf(stderr, "\nExamples:\n");
	fprintf(stderr, "slcand -o -c -f -s6 ttyUSB0\n\n");
	fprintf(stderr, "slcand -o -c -f -s6 ttyUSB0 can0\n\n");
	fprintf(stderr, "slcand -o -c -f -s6 /dev/ttyUSB0\n\n");
	exit(EXIT_FAILURE);
}